

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O3

int __thiscall CASC_CSV::GetString(CASC_CSV *this,char *szBufferPtr,size_t nMaxChars,size_t Index)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  iVar4 = 0x69;
  if (Index < this->nColumns) {
    uVar1 = this->Columns[Index].nLength;
    if (uVar1 <= nMaxChars - 1) {
      pcVar5 = szBufferPtr + (nMaxChars - 1);
      if (szBufferPtr < pcVar5 && 0 < (long)uVar1) {
        pcVar2 = this->Columns[Index].szString;
        pcVar3 = pcVar2;
        do {
          *szBufferPtr = *pcVar3;
          szBufferPtr = szBufferPtr + 1;
          if (pcVar2 + uVar1 <= pcVar3 + 1) break;
          pcVar3 = pcVar3 + 1;
        } while (szBufferPtr < pcVar5);
      }
      *szBufferPtr = '\0';
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int CASC_CSV::GetString(char * szBufferPtr, size_t nMaxChars, size_t Index)
{
    const char * szStringPtr;
    const char * szStringEnd;
    char * szBufferEnd = szBufferPtr + nMaxChars - 1;

    // Check for index overflow and buffer overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;
    if (Columns[Index].nLength > nMaxChars - 1)
        return ERROR_INSUFFICIENT_BUFFER;
    
    // Get the source string
    szStringPtr = Columns[Index].szString;
    szStringEnd = szStringPtr + Columns[Index].nLength;

    // Copy the string
    while (szStringPtr < szStringEnd && szBufferPtr < szBufferEnd)
        *szBufferPtr++ = *szStringPtr++;
    szBufferPtr[0] = 0;
    return ERROR_SUCCESS;
}